

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O1

void __thiscall rest_rpc::rpc_client::error_callback(rpc_client *this,error_code *ec)

{
  error_code local_18;
  
  if ((this->err_cb_).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_18._M_value = ec->_M_value;
    local_18._M_cat = ec->_M_cat;
    (*(this->err_cb_)._M_invoker)((_Any_data *)&this->err_cb_,&local_18);
  }
  if (this->enable_reconnect_ == true) {
    async_reconnect(this);
  }
  return;
}

Assistant:

void error_callback(const asio::error_code &ec) {
    if (err_cb_) {
      err_cb_(ec);
    }

    if (enable_reconnect_) {
      async_reconnect();
    }
  }